

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::ArenaData_*,_RealCount>::EditingIterator::EditingIterator
          (EditingIterator *this,DListBase<Memory::ArenaData_*,_RealCount> *list)

{
  DListBase<Memory::ArenaData_*,_RealCount> *list_local;
  EditingIterator *this_local;
  
  DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Iterator(&this->super_Iterator,list);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }